

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcBuilding::IfcBuilding(IfcBuilding *this)

{
  *(undefined ***)&this->field_0x198 = &PTR__Object_00806870;
  *(undefined8 *)&this->field_0x1a0 = 0;
  *(char **)&this->field_0x1a8 = "IfcBuilding";
  IfcSpatialStructureElement::IfcSpatialStructureElement
            (&this->super_IfcSpatialStructureElement,&PTR_construction_vtable_24__0084c288);
  *(undefined8 *)&(this->super_IfcSpatialStructureElement).field_0x160 = 0;
  *(undefined8 *)&(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject =
       0x84c180;
  *(undefined8 *)&this->field_0x198 = 0x84c270;
  *(undefined8 *)
   &(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.field_0x88 = 0x84c1a8;
  (this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x84c1d0;
  *(undefined8 *)
   &(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.field_0xd0 = 0x84c1f8;
  *(undefined8 *)&(this->super_IfcSpatialStructureElement).super_IfcProduct.field_0x100 = 0x84c220;
  *(undefined8 *)&(this->super_IfcSpatialStructureElement).field_0x158 = 0x84c248;
  this->field_0x170 = 0;
  (this->ElevationOfTerrain).have = false;
  (this->BuildingAddress).ptr.obj = (LazyObject *)0x0;
  (this->BuildingAddress).have = false;
  return;
}

Assistant:

IfcBuilding() : Object("IfcBuilding") {}